

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::strtonum::parse<double>(strtonum *this,double *value)

{
  char cVar1;
  char *pcVar2;
  lconv *plVar3;
  char *pcVar4;
  long lVar5;
  size_t __n;
  char *__nptr;
  long lVar6;
  double dVar7;
  char *endptr;
  string tempstr;
  array<char,_64UL> buf;
  char *local_98;
  char *local_90;
  char *local_88;
  char local_80 [16];
  char local_70 [64];
  
  local_90 = local_80;
  local_88 = (char *)0x0;
  local_80[0] = '\0';
  lVar5 = (long)this->m_end - (long)this->m_start;
  plVar3 = localeconv();
  if (plVar3->decimal_point == (char *)0x0) {
    __nptr = this->m_start;
  }
  else {
    cVar1 = *plVar3->decimal_point;
    __nptr = this->m_start;
    if (cVar1 != '.') {
      local_98 = (char *)CONCAT71(local_98._1_7_,0x2e);
      pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(__nptr);
      pcVar2 = this->m_start;
      lVar6 = (long)pcVar4 - (long)pcVar2;
      if (lVar6 != lVar5) {
        if (lVar5 + 1U < 0x40) {
          __n = (long)this->m_end - (long)pcVar2;
          if (__n != 0) {
            memmove(local_70,pcVar2,__n);
          }
          local_70[lVar5] = '\0';
          local_70[lVar6] = cVar1;
          __nptr = local_70;
        }
        else {
          std::__cxx11::string::replace((ulong)&local_90,0,local_88,(ulong)pcVar2);
          local_90[lVar6] = cVar1;
          __nptr = local_90;
        }
      }
    }
  }
  local_98 = (char *)0x0;
  *value = 0.0;
  dVar7 = strtod(__nptr,&local_98);
  pcVar2 = local_98;
  *value = dVar7;
  if ((((local_98 == __nptr + lVar5) && (dVar7 == 0.0)) && (!NAN(dVar7))) && (*__nptr == '-')) {
    *value = -0.0;
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return pcVar2 == __nptr + lVar5;
}

Assistant:

bool parse(T& value, /*is_integral=*/std::false_type) const
            {
                // replace decimal separator with locale-specific version,
                // when necessary; data will point to either the original
                // string, or buf, or tempstr containing the fixed string.
                std::string tempstr;
                std::array<char, 64> buf;
                const size_t len = static_cast<size_t>(m_end - m_start);

                // lexer will reject empty numbers
                assert(len > 0);

                // since dealing with strtod family of functions, we're
                // getting the decimal point char from the C locale facilities
                // instead of C++'s numpunct facet of the current std::locale
                const auto loc = localeconv();
                assert(loc != nullptr);
                const char decimal_point_char = (loc->decimal_point == nullptr) ? '.' : loc->decimal_point[0];

                const char* data = m_start;

                if (decimal_point_char != '.')
                {
                    const size_t ds_pos = static_cast<size_t>(std::find(m_start, m_end, '.') - m_start);

                    if (ds_pos != len)
                    {
                        // copy the data into the local buffer or tempstr, if
                        // buffer is too small; replace decimal separator, and
                        // update data to point to the modified bytes
                        if ((len + 1) < buf.size())
                        {
                            std::copy(m_start, m_end, buf.begin());
                            buf[len] = 0;
                            buf[ds_pos] = decimal_point_char;
                            data = buf.data();
                        }
                        else
                        {
                            tempstr.assign(m_start, m_end);
                            tempstr[ds_pos] = decimal_point_char;
                            data = tempstr.c_str();
                        }
                    }
                }

                char* endptr = nullptr;
                value = 0;
                // this calls appropriate overload depending on T
                strtof(value, data, &endptr);

                // parsing was successful iff strtof parsed exactly the number
                // of characters determined by the lexer (len)
                const bool ok = (endptr == (data + len));

                if (ok and (value == static_cast<T>(0.0)) and (*data == '-'))
                {
                    // some implementations forget to negate the zero
                    value = -0.0;
                }

                return ok;
            }